

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O3

int32_t __thiscall
webrtc::TraceImpl::SetTraceFileImpl(TraceImpl *this,char *file_name_utf8,bool add_file_counter)

{
  FileWrapper *pFVar1;
  int iVar2;
  int32_t iVar3;
  TraceImpl *this_00;
  CritScope lock;
  char file_name_with_counter_utf8 [1024];
  CritScope local_420;
  char local_418 [1024];
  
  rtc::CritScope::CritScope(&local_420,&this->crit_);
  pFVar1 = (this->trace_file_).impl_.data_.ptr;
  if (pFVar1 == (FileWrapper *)0x0) {
LAB_0018e7f2:
    __assert_fail("impl_.get() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/scoped_ptr.h"
                  ,0x184,
                  "element_type *rtc::scoped_ptr<webrtc::FileWrapper>::operator->() const [T = webrtc::FileWrapper, D = rtc::DefaultDeleter<webrtc::FileWrapper>]"
                 );
  }
  (*(pFVar1->super_InStream)._vptr_InStream[9])();
  this_00 = (TraceImpl *)(this->trace_file_).impl_.data_.ptr;
  if (this_00 == (TraceImpl *)0x0) goto LAB_0018e7f2;
  (*((InStream *)&this_00->_vptr_TraceImpl)->_vptr_InStream[7])();
  if (file_name_utf8 != (char *)0x0) {
    if (add_file_counter) {
      this->file_count_text_ = 1;
      CreateFileName(this_00,file_name_utf8,local_418,1);
      pFVar1 = (this->trace_file_).impl_.data_.ptr;
      if (pFVar1 == (FileWrapper *)0x0) goto LAB_0018e7f2;
      iVar2 = (*(pFVar1->super_InStream)._vptr_InStream[5])(pFVar1,local_418,0,0,1);
    }
    else {
      this->file_count_text_ = 0;
      pFVar1 = (this->trace_file_).impl_.data_.ptr;
      if (pFVar1 == (FileWrapper *)0x0) goto LAB_0018e7f2;
      iVar2 = (*(pFVar1->super_InStream)._vptr_InStream[5])(pFVar1,file_name_utf8,0,0,1);
    }
    if (iVar2 == -1) {
      iVar3 = -1;
      goto LAB_0018e7da;
    }
  }
  this->row_count_text_ = 0;
  iVar3 = 0;
LAB_0018e7da:
  rtc::CritScope::~CritScope(&local_420);
  return iVar3;
}

Assistant:

int32_t TraceImpl::SetTraceFileImpl(const char* file_name_utf8,
                                    const bool add_file_counter) {
  rtc::CritScope lock(&crit_);

  trace_file_->Flush();
  trace_file_->CloseFile();

  if (file_name_utf8) {
    if (add_file_counter) {
      file_count_text_ = 1;

      char file_name_with_counter_utf8[FileWrapper::kMaxFileNameSize];
      CreateFileName(file_name_utf8, file_name_with_counter_utf8,
                     file_count_text_);
      if (trace_file_->OpenFile(file_name_with_counter_utf8, false, false,
                               true) == -1) {
        return -1;
      }
    } else {
      file_count_text_ = 0;
      if (trace_file_->OpenFile(file_name_utf8, false, false, true) == -1) {
        return -1;
      }
    }
  }
  row_count_text_ = 0;
  return 0;
}